

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetLinkerTypeProperty
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  string *psVar2;
  cmLocalGenerator *lg;
  static_string_view sVar3;
  anon_class_16_2_bd2eff0b_for__M_pred pred;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  undefined1 local_1b8 [8];
  static_string_view DL_END;
  static_string_view DL_BEGIN;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  iterator local_170;
  size_type local_168;
  undefined1 local_160 [8];
  cmList list;
  undefined1 local_128 [8];
  string ltype;
  undefined1 local_e8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  cmValue linkerType;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string propName;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  propName.field_2._8_8_ = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"LINKER_TYPE",&local_49);
  std::allocator<char>::~allocator(&local_49);
  dagChecker._120_8_ = GetProperty(this,(string *)local_48);
  bVar1 = cmValue::IsEmpty((cmValue *)&dagChecker.CheckResult);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)(ltype.field_2._M_local_buf + 8),(string *)local_48);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_e8,this,(string *)((long)&ltype.field_2 + 8)
               ,(GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)(ltype.field_2._M_local_buf + 8));
    psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)&dagChecker.CheckResult);
    std::__cxx11::string::string
              ((string *)
               &list.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar2);
    lg = GetLocalGenerator(this);
    cmGeneratorExpression::Evaluate
              ((string *)local_128,
               (string *)
               &list.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,lg,
               (string *)propName.field_2._8_8_,this,(cmGeneratorExpressionDAGChecker *)local_e8,
               this,lang);
    std::__cxx11::string::~string
              ((string *)
               &list.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = IsDeviceLink(this);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_190,(string *)local_128);
      local_170 = &local_190;
      local_168 = 1;
      init._M_len = 1;
      init._M_array = local_170;
      cmList::cmList((cmList *)local_160,init);
      local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170;
      do {
        local_208 = local_208 + -1;
        std::__cxx11::string::~string((string *)local_208);
      } while (local_208 != &local_190);
      sVar3 = ::cm::operator____s("<DEVICE_LINK>",0xd);
      DL_END.super_string_view._M_str = (char *)sVar3.super_string_view._M_len;
      sVar3 = ::cm::operator____s("</DEVICE_LINK>",0xe);
      DL_END.super_string_view._M_len = (size_t)sVar3.super_string_view._M_str;
      local_1b8 = (undefined1  [8])sVar3.super_string_view._M_len;
      pred.DL_END = (static_string_view *)local_1b8;
      pred.DL_BEGIN = (static_string_view *)local_1b8;
      ::cm::
      erase_if<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                ((cm *)local_160,(cmList *)&DL_END.super_string_view._M_str,pred);
      cmList::to_string_abi_cxx11_(__return_storage_ptr__,(cmList *)local_160);
      cmList::~cmList((cmList *)local_160);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_128);
    }
    std::__cxx11::string::~string((string *)local_128);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_e8);
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetLinkerTypeProperty(
  std::string const& lang, std::string const& config) const
{
  std::string propName{ "LINKER_TYPE" };
  auto linkerType = this->GetProperty(propName);
  if (!linkerType.IsEmpty()) {
    cmGeneratorExpressionDAGChecker dagChecker(this, propName, nullptr,
                                               nullptr);
    auto ltype =
      cmGeneratorExpression::Evaluate(*linkerType, this->GetLocalGenerator(),
                                      config, this, &dagChecker, this, lang);
    if (this->IsDeviceLink()) {
      cmList list{ ltype };
      const auto DL_BEGIN = "<DEVICE_LINK>"_s;
      const auto DL_END = "</DEVICE_LINK>"_s;
      cm::erase_if(list, [&](const std::string& item) {
        return item == DL_BEGIN || item == DL_END;
      });
      return list.to_string();
    }
    return ltype;
  }
  return std::string{};
}